

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_1::BasicExpressionGroup::init
          (BasicExpressionGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  RandomShaderCase *pRVar2;
  int seed;
  deUint32 seed_00;
  ProgramParameters local_98;
  
  local_98.vertexParameters.randomize = false;
  local_98.seed = 0;
  local_98.version = VERSION_100;
  local_98.vertexParameters.maxStatementDepth = 2;
  local_98.vertexParameters.maxStatementsPerBlock = 10;
  local_98.vertexParameters.maxExpressionDepth = 5;
  local_98.vertexParameters.maxCombinedVariableScalars = 0x20;
  local_98.vertexParameters.maxUniformScalars = 0x200;
  local_98.vertexParameters.maxInputVariables = 8;
  local_98.vertexParameters.texLookupBaseWeight = 0.0;
  local_98.vertexParameters.maxSamplers = 8;
  local_98.vertexParameters.useTexture2D = false;
  local_98.vertexParameters.useTextureCube = false;
  local_98.fragmentParameters.randomize = false;
  local_98.fragmentParameters.maxStatementDepth = 2;
  local_98.fragmentParameters.maxStatementsPerBlock = 10;
  local_98.fragmentParameters.maxExpressionDepth = 5;
  local_98.fragmentParameters.maxCombinedVariableScalars = 0x20;
  local_98.fragmentParameters.maxUniformScalars = 0x200;
  local_98.fragmentParameters.maxInputVariables = 8;
  local_98.fragmentParameters.texLookupBaseWeight = 0.0;
  local_98.fragmentParameters.maxSamplers = 8;
  local_98.fragmentParameters.useTexture2D = false;
  local_98.fragmentParameters.useTextureCube = false;
  local_98.declarationStatementBaseWeight = true;
  local_98.trigonometricBaseWeight = 0.0;
  local_98.exponentialBaseWeight = 0.0;
  local_98.useScalarConversions = false;
  local_98.useSwizzle = false;
  local_98.useComparisonOps = false;
  local_98.useConditionals = false;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combined",
             "Combined tests");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  seed_00 = 0;
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pRVar2 = createRandomShaderCase
                       ((anon_unknown_1 *)pCVar1->m_testCtx,(Context *)pCVar1->m_renderCtx,
                        "Random expressions in vertex shader",&local_98,seed_00,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar2);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pRVar2 = createRandomShaderCase
                       ((anon_unknown_1 *)pCVar1->m_testCtx,(Context *)pCVar1->m_renderCtx,
                        "Random expressions in fragment shader",&local_98,seed_00,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar2);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pRVar2 = createRandomShaderCase
                       ((anon_unknown_1 *)pCVar1->m_testCtx,(Context *)pCVar1->m_renderCtx,
                        "Random expressions in vertex and fragment shaders",&local_98,seed_00,true,
                        true);
    tcu::TestNode::addChild(node_01,(TestNode *)pRVar2);
    seed_00 = seed_00 + 1;
  } while (seed_00 != 100);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		tcu::TestCaseGroup* combinedGroup = new tcu::TestCaseGroup(m_testCtx, "combined", "Combined tests");
		addChild(combinedGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Random expressions in vertex shader",					params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Random expressions in fragment shader",				params, seed, false, true));
			combinedGroup->addChild(createRandomShaderCase(m_context,	"Random expressions in vertex and fragment shaders",	params, seed, true, true));
		}
	}